

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_realm_stat(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  char *name;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getsym(p,"stat");
    wVar1 = stat_name_to_idx(name);
    *(wchar_t *)((long)pvVar3 + 0x18) = wVar1;
    pVar2 = wVar1 >> 0x1f & PARSE_ERROR_INVALID_SPELL_STAT;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_realm_stat(struct parser *p) {
	struct magic_realm *realm = parser_priv(p);

	if (!realm) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	realm->stat = stat_name_to_idx(parser_getsym(p, "stat"));
	if (realm->stat < 0) {
		return PARSE_ERROR_INVALID_SPELL_STAT;
	}
	return PARSE_ERROR_NONE;
}